

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

ImVec2 ImBezierCubicCalc(ImVec2 *p1,ImVec2 *p2,ImVec2 *p3,ImVec2 *p4,float t)

{
  float *in_RCX;
  float *in_RDX;
  float *in_RSI;
  float *in_RDI;
  float in_XMM0_Da;
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float w4;
  float w3;
  float w2;
  float w1;
  float u;
  ImVec2 local_8;
  
  fVar1 = 1.0 - in_XMM0_Da;
  fVar2 = fVar1 * fVar1 * fVar1;
  fVar3 = fVar1 * 3.0 * fVar1 * in_XMM0_Da;
  fVar1 = fVar1 * 3.0 * in_XMM0_Da * in_XMM0_Da;
  fVar4 = in_XMM0_Da * in_XMM0_Da * in_XMM0_Da;
  ImVec2::ImVec2(&local_8,fVar4 * *in_RCX + fVar1 * *in_RDX + fVar2 * *in_RDI + fVar3 * *in_RSI,
                 fVar4 * in_RCX[1] + fVar1 * in_RDX[1] + fVar2 * in_RDI[1] + fVar3 * in_RSI[1]);
  return local_8;
}

Assistant:

ImVec2 ImBezierCubicCalc(const ImVec2& p1, const ImVec2& p2, const ImVec2& p3, const ImVec2& p4, float t)
{
    float u = 1.0f - t;
    float w1 = u * u * u;
    float w2 = 3 * u * u * t;
    float w3 = 3 * u * t * t;
    float w4 = t * t * t;
    return ImVec2(w1 * p1.x + w2 * p2.x + w3 * p3.x + w4 * p4.x, w1 * p1.y + w2 * p2.y + w3 * p3.y + w4 * p4.y);
}